

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffplsw(fitsfile *fptr,int *status)

{
  int iVar1;
  int *in_RSI;
  char *in_RDI;
  int tstatus;
  char comm [73];
  char valstring [71];
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  fitsfile *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RSI < 1) {
    iVar1 = ffgkys(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (iVar1 == 0) {
      iVar1 = *in_RSI;
    }
    else {
      ffpkys((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
             (char *)in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      ffpcom(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             &in_stack_ffffffffffffff98->HDUposition);
      ffpcom(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             &in_stack_ffffffffffffff98->HDUposition);
      ffpcom(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             &in_stack_ffffffffffffff98->HDUposition);
      ffpcom(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             &in_stack_ffffffffffffff98->HDUposition);
      iVar1 = *in_RSI;
    }
  }
  else {
    iVar1 = *in_RSI;
  }
  return iVar1;
}

Assistant:

int ffplsw( fitsfile *fptr,     /* I - FITS file pointer  */
            int  *status)       /* IO - error status       */
/*
  Write the LONGSTRN keyword and a series of related COMMENT keywords
  which document that this FITS header may contain long string keyword
  values which are continued over multiple keywords using the HEASARC
  long string keyword convention.  If the LONGSTRN keyword already exists
  then this routine simple returns without doing anything.
*/
{
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT];
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = 0;
    if (ffgkys(fptr, "LONGSTRN", valstring, comm, &tstatus) == 0)
        return(*status);     /* keyword already exists, so just return */

    ffpkys(fptr, "LONGSTRN", "OGIP 1.0", 
       "The HEASARC Long String Convention may be used.", status);

    ffpcom(fptr,
    "  This FITS file may contain long string keyword values that are", status);

    ffpcom(fptr,
    "  continued over multiple keywords.  The HEASARC convention uses the &",
    status);

    ffpcom(fptr,
    "  character at the end of each substring which is then continued", status);

    ffpcom(fptr,
    "  on the next keyword which has the name CONTINUE.", status);

    return(*status);
}